

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::decode_value(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
               *this,int32_t k,int32_t limit,int32_t quantized_bits_per_pixel)

{
  int32_t iVar1;
  int32_t high_bits;
  int32_t quantized_bits_per_pixel_local;
  int32_t limit_local;
  int32_t k_local;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
  *this_local;
  
  this_local._4_4_ = decoder_strategy::read_high_bits(&this->super_decoder_strategy);
  if (this_local._4_4_ < limit - (quantized_bits_per_pixel + 1)) {
    if (k != 0) {
      iVar1 = decoder_strategy::read_value(&this->super_decoder_strategy,k);
      this_local._4_4_ = (this_local._4_4_ << ((byte)k & 0x1f)) + iVar1;
    }
  }
  else {
    iVar1 = decoder_strategy::read_value(&this->super_decoder_strategy,quantized_bits_per_pixel);
    this_local._4_4_ = iVar1 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t decode_value(const int32_t k, const int32_t limit, const int32_t quantized_bits_per_pixel)
    {
        const int32_t high_bits{Strategy::read_high_bits()};

        if (high_bits >= limit - (quantized_bits_per_pixel + 1))
            return Strategy::read_value(quantized_bits_per_pixel) + 1;

        if (k == 0)
            return high_bits;

        return (high_bits << k) + Strategy::read_value(k);
    }